

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-prim-types.cc
# Opt level: O0

void prim_type_test(void)

{
  bool bVar1;
  type *ptVar2;
  type *ptVar3;
  string *psVar4;
  Path *pPVar5;
  ostream *poVar6;
  allocator local_26b1;
  string local_26b0;
  allocator local_2689;
  string local_2688;
  undefined1 local_2668 [8];
  Path gpath;
  string local_2590;
  allocator local_2569;
  string local_2568;
  undefined1 local_2548 [8];
  Path fpath;
  string local_2470;
  allocator local_2449;
  string local_2448;
  undefined1 local_2428 [8];
  Path epath_1;
  string local_2350;
  allocator local_2329;
  string local_2328;
  undefined1 local_2308 [8];
  Path dpath_1;
  string local_2230;
  allocator local_2209;
  string local_2208;
  undefined1 local_21e8 [8];
  Path cpath_2;
  string local_2110;
  allocator local_20e9;
  string local_20e8;
  undefined1 local_20c8 [8];
  Path bpath_1;
  string local_1ff0;
  allocator local_1fc9;
  string local_1fc8;
  undefined1 local_1fa8 [8];
  Path apath_4;
  allocator local_1eb1;
  string local_1eb0;
  undefined1 local_1e90 [8];
  Path epath;
  string local_1db8;
  undefined1 local_1d98 [8];
  Path dpath;
  string local_1cc0;
  allocator local_1c99;
  string local_1c98;
  undefined1 local_1c78 [8];
  Path cpath_1;
  string local_1ba0;
  allocator local_1b79;
  string local_1b78;
  undefined1 local_1b58 [8];
  Path bpath;
  string local_1a80;
  allocator local_1a59;
  string local_1a58;
  undefined1 local_1a38 [8];
  Path apath_3;
  string local_1898;
  Path local_1878;
  string local_17a8;
  Path local_1788;
  string local_16b8;
  string local_1698;
  allocator local_1671;
  string local_1670;
  allocator local_1649;
  string local_1648;
  undefined1 local_1628 [8];
  Path apath_2;
  allocator local_1531;
  string local_1530;
  allocator local_1509;
  string local_1508;
  undefined1 local_14e8 [8];
  Path apath_1;
  allocator local_13f1;
  string local_13f0;
  allocator local_13c9;
  string local_13c8;
  undefined1 local_13a8 [8];
  Path rpath_1;
  string local_1208;
  undefined1 local_11e8 [8];
  Path c;
  string local_1110;
  allocator local_10e9;
  string local_10e8;
  undefined1 local_10c8 [8];
  Path cpath;
  allocator local_fd1;
  string local_fd0;
  allocator local_fa9;
  string local_fa8;
  undefined1 local_f88 [8];
  Path apath;
  allocator local_e91;
  string local_e90;
  allocator local_e69;
  string local_e68;
  undefined1 local_e48 [8];
  Path rpath;
  string local_ca8;
  undefined1 local_c88 [8];
  pair<tinyusdz::Path,_tinyusdz::Path> ret_2;
  string local_ae0;
  allocator local_ab9;
  string local_ab8;
  undefined1 local_a98 [8];
  Path path_3;
  string local_9a8;
  undefined1 local_988 [8];
  pair<tinyusdz::Path,_tinyusdz::Path> ret_1;
  string local_7e0;
  allocator local_7b9;
  string local_7b8;
  undefined1 local_798 [8];
  Path path_2;
  string local_5f8;
  Path local_5d8;
  string local_508;
  string local_4e8;
  undefined1 local_4c8 [8];
  pair<tinyusdz::Path,_tinyusdz::Path> ret;
  string local_320;
  allocator local_2f9;
  string local_2f8;
  undefined1 local_2d8 [8];
  Path path_1;
  allocator local_131;
  string local_130;
  allocator local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  Path path;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"/",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"",&local_131);
  tinyusdz::Path::Path((Path *)local_d8,&local_f8,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  bVar1 = tinyusdz::Path::is_root_path((Path *)local_d8);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x11,"%s","path.is_root_path() == true");
  bVar1 = tinyusdz::Path::is_root_prim((Path *)local_d8);
  acutest_check_((byte)~bVar1 & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x12,"%s","path.is_root_prim() == false");
  tinyusdz::Path::get_parent_path((Path *)&path_1._valid,(Path *)local_d8);
  bVar1 = tinyusdz::Path::is_valid((Path *)&path_1._valid);
  acutest_check_((byte)~bVar1 & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x14,"%s","path.get_parent_path().is_valid() == false");
  tinyusdz::Path::~Path((Path *)&path_1._valid);
  tinyusdz::Path::~Path((Path *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f8,"/bora",&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_320,"",(allocator *)&ret.second.field_0xcf);
  tinyusdz::Path::Path((Path *)local_2d8,&local_2f8,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&ret.second.field_0xcf);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  tinyusdz::Path::split_at_root((pair<tinyusdz::Path,_tinyusdz::Path> *)local_4c8,(Path *)local_2d8)
  ;
  ptVar2 = std::get<0ul,tinyusdz::Path,tinyusdz::Path>
                     ((pair<tinyusdz::Path,_tinyusdz::Path> *)local_4c8);
  tinyusdz::Path::full_path_name_abi_cxx11_(&local_4e8,ptVar2);
  bVar1 = std::operator==(&local_4e8,"/bora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x1a,"%s","std::get<0>(ret).full_path_name() == \"/bora\"");
  std::__cxx11::string::~string((string *)&local_4e8);
  ptVar3 = std::get<1ul,tinyusdz::Path,tinyusdz::Path>
                     ((pair<tinyusdz::Path,_tinyusdz::Path> *)local_4c8);
  bVar1 = tinyusdz::Path::is_empty(ptVar3);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x1b,"%s","std::get<1>(ret).is_empty() == true");
  tinyusdz::Path::get_parent_path(&local_5d8,(Path *)local_2d8);
  tinyusdz::Path::full_path_name_abi_cxx11_(&local_508,&local_5d8);
  bVar1 = std::operator==(&local_508,"/");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x1c,"%s","path.get_parent_path().full_path_name() == \"/\"");
  std::__cxx11::string::~string((string *)&local_508);
  tinyusdz::Path::~Path(&local_5d8);
  tinyusdz::Path::get_parent_prim_path((Path *)&path_2._valid,(Path *)local_2d8);
  tinyusdz::Path::full_path_name_abi_cxx11_(&local_5f8,(Path *)&path_2._valid);
  bVar1 = std::operator==(&local_5f8,"/bora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x1d,"%s","path.get_parent_prim_path().full_path_name() == \"/bora\"");
  std::__cxx11::string::~string((string *)&local_5f8);
  tinyusdz::Path::~Path((Path *)&path_2._valid);
  std::pair<tinyusdz::Path,_tinyusdz::Path>::~pair
            ((pair<tinyusdz::Path,_tinyusdz::Path> *)local_4c8);
  tinyusdz::Path::~Path((Path *)local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7b8,"/dora/bora",&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7e0,"",(allocator *)&ret_1.second.field_0xcf);
  tinyusdz::Path::Path((Path *)local_798,&local_7b8,&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)&ret_1.second.field_0xcf);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  psVar4 = tinyusdz::Path::element_name_abi_cxx11_((Path *)local_798);
  bVar1 = std::operator==(psVar4,"bora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x22,"%s","path.element_name() == \"bora\"");
  tinyusdz::Path::split_at_root((pair<tinyusdz::Path,_tinyusdz::Path> *)local_988,(Path *)local_798)
  ;
  ptVar2 = std::get<0ul,tinyusdz::Path,tinyusdz::Path>
                     ((pair<tinyusdz::Path,_tinyusdz::Path> *)local_988);
  bVar1 = tinyusdz::Path::is_valid(ptVar2);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x24,"%s","std::get<0>(ret).is_valid() == true");
  ptVar2 = std::get<0ul,tinyusdz::Path,tinyusdz::Path>
                     ((pair<tinyusdz::Path,_tinyusdz::Path> *)local_988);
  tinyusdz::Path::full_path_name_abi_cxx11_(&local_9a8,ptVar2);
  bVar1 = std::operator==(&local_9a8,"/dora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x25,"%s","std::get<0>(ret).full_path_name() == \"/dora\"");
  std::__cxx11::string::~string((string *)&local_9a8);
  ptVar3 = std::get<1ul,tinyusdz::Path,tinyusdz::Path>
                     ((pair<tinyusdz::Path,_tinyusdz::Path> *)local_988);
  bVar1 = tinyusdz::Path::is_valid(ptVar3);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x26,"%s","std::get<1>(ret).is_valid() == true");
  ptVar3 = std::get<1ul,tinyusdz::Path,tinyusdz::Path>
                     ((pair<tinyusdz::Path,_tinyusdz::Path> *)local_988);
  tinyusdz::Path::full_path_name_abi_cxx11_((string *)&path_3._valid,ptVar3);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &path_3._valid,"/bora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x27,"%s","std::get<1>(ret).full_path_name() == \"/bora\"");
  std::__cxx11::string::~string((string *)&path_3._valid);
  std::pair<tinyusdz::Path,_tinyusdz::Path>::~pair
            ((pair<tinyusdz::Path,_tinyusdz::Path> *)local_988);
  tinyusdz::Path::~Path((Path *)local_798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ab8,"dora",&local_ab9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ae0,"",(allocator *)&ret_2.second.field_0xcf);
  tinyusdz::Path::Path((Path *)local_a98,&local_ab8,&local_ae0);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)&ret_2.second.field_0xcf);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
  tinyusdz::Path::split_at_root((pair<tinyusdz::Path,_tinyusdz::Path> *)local_c88,(Path *)local_a98)
  ;
  ptVar2 = std::get<0ul,tinyusdz::Path,tinyusdz::Path>
                     ((pair<tinyusdz::Path,_tinyusdz::Path> *)local_c88);
  bVar1 = tinyusdz::Path::is_empty(ptVar2);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x2d,"%s","std::get<0>(ret).is_empty() == true");
  ptVar3 = std::get<1ul,tinyusdz::Path,tinyusdz::Path>
                     ((pair<tinyusdz::Path,_tinyusdz::Path> *)local_c88);
  bVar1 = tinyusdz::Path::is_valid(ptVar3);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x2e,"%s","std::get<1>(ret).is_valid() == true");
  ptVar3 = std::get<1ul,tinyusdz::Path,tinyusdz::Path>
                     ((pair<tinyusdz::Path,_tinyusdz::Path> *)local_c88);
  tinyusdz::Path::full_path_name_abi_cxx11_(&local_ca8,ptVar3);
  bVar1 = std::operator==(&local_ca8,"dora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x2f,"%s","std::get<1>(ret).full_path_name() == \"dora\"");
  std::__cxx11::string::~string((string *)&local_ca8);
  tinyusdz::Path::get_parent_path((Path *)&rpath._valid,(Path *)local_a98);
  bVar1 = tinyusdz::Path::is_valid((Path *)&rpath._valid);
  acutest_check_((byte)~bVar1 & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x30,"%s","path.get_parent_path().is_valid() == false");
  tinyusdz::Path::~Path((Path *)&rpath._valid);
  std::pair<tinyusdz::Path,_tinyusdz::Path>::~pair
            ((pair<tinyusdz::Path,_tinyusdz::Path> *)local_c88);
  tinyusdz::Path::~Path((Path *)local_a98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e68,"dora",&local_e69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e90,"",&local_e91);
  tinyusdz::Path::Path((Path *)local_e48,&local_e68,&local_e90);
  std::__cxx11::string::~string((string *)&local_e90);
  std::allocator<char>::~allocator((allocator<char> *)&local_e91);
  std::__cxx11::string::~string((string *)&local_e68);
  std::allocator<char>::~allocator((allocator<char> *)&local_e69);
  pPVar5 = tinyusdz::Path::make_relative((Path *)local_e48);
  tinyusdz::Path::full_path_name_abi_cxx11_((string *)&apath._valid,pPVar5);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &apath._valid,"dora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x35,"%s","rpath.make_relative().full_path_name() == \"dora\"");
  std::__cxx11::string::~string((string *)&apath._valid);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fa8,"/dora",&local_fa9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fd0,"",&local_fd1);
  tinyusdz::Path::Path((Path *)local_f88,&local_fa8,&local_fd0);
  std::__cxx11::string::~string((string *)&local_fd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fd1);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa9);
  pPVar5 = tinyusdz::Path::make_relative((Path *)local_f88);
  tinyusdz::Path::full_path_name_abi_cxx11_((string *)&cpath._valid,pPVar5);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &cpath._valid,"dora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x38,"%s","apath.make_relative().full_path_name() == \"dora\"");
  std::__cxx11::string::~string((string *)&cpath._valid);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10e8,"/dora",&local_10e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1110,"",(allocator *)&c.field_0xcf);
  tinyusdz::Path::Path((Path *)local_10c8,&local_10e8,&local_1110);
  std::__cxx11::string::~string((string *)&local_1110);
  std::allocator<char>::~allocator((allocator<char> *)&c.field_0xcf);
  std::__cxx11::string::~string((string *)&local_10e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10e9);
  tinyusdz::Path::Path((Path *)local_11e8);
  tinyusdz::Path::make_relative((Path *)&rpath_1._valid,(Path *)local_10c8);
  tinyusdz::Path::full_path_name_abi_cxx11_(&local_1208,(Path *)&rpath_1._valid);
  bVar1 = std::operator==(&local_1208,"dora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x3c,"%s","c.make_relative(cpath).full_path_name() == \"dora\"");
  std::__cxx11::string::~string((string *)&local_1208);
  tinyusdz::Path::~Path((Path *)&rpath_1._valid);
  tinyusdz::Path::~Path((Path *)local_11e8);
  tinyusdz::Path::~Path((Path *)local_10c8);
  tinyusdz::Path::~Path((Path *)local_f88);
  tinyusdz::Path::~Path((Path *)local_e48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13c8,"/dora",&local_13c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13f0,"bora",&local_13f1);
  tinyusdz::Path::Path((Path *)local_13a8,&local_13c8,&local_13f0);
  std::__cxx11::string::~string((string *)&local_13f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13f1);
  std::__cxx11::string::~string((string *)&local_13c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13c9);
  tinyusdz::Path::full_path_name_abi_cxx11_((string *)&apath_1._valid,(Path *)local_13a8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &apath_1._valid,"/dora.bora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x41,"%s","rpath.full_path_name() == \"/dora.bora\"");
  std::__cxx11::string::~string((string *)&apath_1._valid);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1508,"/dora.bora",&local_1509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1530,"",&local_1531);
  tinyusdz::Path::Path((Path *)local_14e8,&local_1508,&local_1530);
  std::__cxx11::string::~string((string *)&local_1530);
  std::allocator<char>::~allocator((allocator<char> *)&local_1531);
  std::__cxx11::string::~string((string *)&local_1508);
  std::allocator<char>::~allocator((allocator<char> *)&local_1509);
  tinyusdz::Path::full_path_name_abi_cxx11_((string *)&apath_2._valid,(Path *)local_14e8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &apath_2._valid,"/dora.bora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x46,"%s","apath.full_path_name() == \"/dora.bora\"");
  std::__cxx11::string::~string((string *)&apath_2._valid);
  psVar4 = tinyusdz::Path::element_name_abi_cxx11_((Path *)local_14e8);
  bVar1 = std::operator==(psVar4,"bora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x47,"%s","apath.element_name() == \"bora\"");
  tinyusdz::Path::~Path((Path *)local_14e8);
  tinyusdz::Path::~Path((Path *)local_13a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1648,"/dora",&local_1649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1670,"bora",&local_1671);
  tinyusdz::Path::Path((Path *)local_1628,&local_1648,&local_1670);
  std::__cxx11::string::~string((string *)&local_1670);
  std::allocator<char>::~allocator((allocator<char> *)&local_1671);
  std::__cxx11::string::~string((string *)&local_1648);
  std::allocator<char>::~allocator((allocator<char> *)&local_1649);
  tinyusdz::Path::full_path_name_abi_cxx11_(&local_1698,(Path *)local_1628);
  bVar1 = std::operator==(&local_1698,"/dora.bora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x4c,"%s","apath.full_path_name() == \"/dora.bora\"");
  std::__cxx11::string::~string((string *)&local_1698);
  psVar4 = tinyusdz::Path::element_name_abi_cxx11_((Path *)local_1628);
  bVar1 = std::operator==(psVar4,"bora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x4d,"%s","apath.element_name() == \"bora\"");
  poVar6 = std::operator<<((ostream *)&std::cout,"parent_path = ");
  tinyusdz::Path::get_parent_path(&local_1788,(Path *)local_1628);
  tinyusdz::Path::full_path_name_abi_cxx11_(&local_16b8,&local_1788);
  poVar6 = std::operator<<(poVar6,(string *)&local_16b8);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&local_16b8);
  tinyusdz::Path::~Path(&local_1788);
  poVar6 = std::operator<<((ostream *)&std::cout,"parent_path = ");
  tinyusdz::Path::get_parent_prim_path(&local_1878,(Path *)local_1628);
  tinyusdz::Path::full_path_name_abi_cxx11_(&local_17a8,&local_1878);
  poVar6 = std::operator<<(poVar6,(string *)&local_17a8);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&local_17a8);
  tinyusdz::Path::~Path(&local_1878);
  tinyusdz::Path::get_parent_path((Path *)&apath_3._valid,(Path *)local_1628);
  tinyusdz::Path::full_path_name_abi_cxx11_(&local_1898,(Path *)&apath_3._valid);
  bVar1 = std::operator==(&local_1898,"/dora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x51,"%s","apath.get_parent_path().full_path_name() == \"/dora\"");
  std::__cxx11::string::~string((string *)&local_1898);
  tinyusdz::Path::~Path((Path *)&apath_3._valid);
  tinyusdz::Path::~Path((Path *)local_1628);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a58,"/dora/bora",&local_1a59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a80,"",(allocator *)&bpath.field_0xcf);
  tinyusdz::Path::Path((Path *)local_1a38,&local_1a58,&local_1a80);
  std::__cxx11::string::~string((string *)&local_1a80);
  std::allocator<char>::~allocator((allocator<char> *)&bpath.field_0xcf);
  std::__cxx11::string::~string((string *)&local_1a58);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b78,"/dora",&local_1b79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ba0,"",(allocator *)&cpath_1.field_0xcf);
  tinyusdz::Path::Path((Path *)local_1b58,&local_1b78,&local_1ba0);
  std::__cxx11::string::~string((string *)&local_1ba0);
  std::allocator<char>::~allocator((allocator<char> *)&cpath_1.field_0xcf);
  std::__cxx11::string::~string((string *)&local_1b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c98,"/doraa",&local_1c99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1cc0,"",(allocator *)&dpath.field_0xcf);
  tinyusdz::Path::Path((Path *)local_1c78,&local_1c98,&local_1cc0);
  std::__cxx11::string::~string((string *)&local_1cc0);
  std::allocator<char>::~allocator((allocator<char> *)&dpath.field_0xcf);
  std::__cxx11::string::~string((string *)&local_1c98);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1db8,"hello",(allocator *)&epath.field_0xcf);
  tinyusdz::Path::AppendProperty((Path *)local_1d98,(Path *)local_1b58,&local_1db8);
  std::__cxx11::string::~string((string *)&local_1db8);
  std::allocator<char>::~allocator((allocator<char> *)&epath.field_0xcf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1eb0,"hell",&local_1eb1);
  tinyusdz::Path::AppendProperty((Path *)local_1e90,(Path *)local_1b58,&local_1eb0);
  std::__cxx11::string::~string((string *)&local_1eb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1eb1);
  poVar6 = std::operator<<((ostream *)&std::cout,"epath = ");
  tinyusdz::Path::full_path_name_abi_cxx11_((string *)&apath_4._valid,(Path *)local_1e90);
  poVar6 = std::operator<<(poVar6,(string *)&apath_4._valid);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&apath_4._valid);
  bVar1 = tinyusdz::Path::operator<((Path *)local_1b58,(Path *)local_1a38);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x5d,"%s","bpath < apath");
  bVar1 = tinyusdz::Path::operator<((Path *)local_1b58,(Path *)local_1c78);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x5e,"%s","bpath < cpath");
  bVar1 = tinyusdz::Path::operator<((Path *)local_1b58,(Path *)local_1d98);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x5f,"%s","bpath < dpath");
  bVar1 = tinyusdz::Path::operator<((Path *)local_1e90,(Path *)local_1d98);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x60,"%s","epath < dpath");
  tinyusdz::Path::~Path((Path *)local_1e90);
  tinyusdz::Path::~Path((Path *)local_1d98);
  tinyusdz::Path::~Path((Path *)local_1c78);
  tinyusdz::Path::~Path((Path *)local_1b58);
  tinyusdz::Path::~Path((Path *)local_1a38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1fc8,"/dora/bora",&local_1fc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ff0,"",(allocator *)&bpath_1.field_0xcf);
  tinyusdz::Path::Path((Path *)local_1fa8,&local_1fc8,&local_1ff0);
  std::__cxx11::string::~string((string *)&local_1ff0);
  std::allocator<char>::~allocator((allocator<char> *)&bpath_1.field_0xcf);
  std::__cxx11::string::~string((string *)&local_1fc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_20e8,"/dora/bora2",&local_20e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2110,"",(allocator *)&cpath_2.field_0xcf);
  tinyusdz::Path::Path((Path *)local_20c8,&local_20e8,&local_2110);
  std::__cxx11::string::~string((string *)&local_2110);
  std::allocator<char>::~allocator((allocator<char> *)&cpath_2.field_0xcf);
  std::__cxx11::string::~string((string *)&local_20e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_20e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2208,"/doraa",&local_2209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2230,"",(allocator *)&dpath_1.field_0xcf);
  tinyusdz::Path::Path((Path *)local_21e8,&local_2208,&local_2230);
  std::__cxx11::string::~string((string *)&local_2230);
  std::allocator<char>::~allocator((allocator<char> *)&dpath_1.field_0xcf);
  std::__cxx11::string::~string((string *)&local_2208);
  std::allocator<char>::~allocator((allocator<char> *)&local_2209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2328,"/",&local_2329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2350,"",(allocator *)&epath_1.field_0xcf);
  tinyusdz::Path::Path((Path *)local_2308,&local_2328,&local_2350);
  std::__cxx11::string::~string((string *)&local_2350);
  std::allocator<char>::~allocator((allocator<char> *)&epath_1.field_0xcf);
  std::__cxx11::string::~string((string *)&local_2328);
  std::allocator<char>::~allocator((allocator<char> *)&local_2329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2448,"/dora",&local_2449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2470,"",(allocator *)&fpath.field_0xcf);
  tinyusdz::Path::Path((Path *)local_2428,&local_2448,&local_2470);
  std::__cxx11::string::~string((string *)&local_2470);
  std::allocator<char>::~allocator((allocator<char> *)&fpath.field_0xcf);
  std::__cxx11::string::~string((string *)&local_2448);
  std::allocator<char>::~allocator((allocator<char> *)&local_2449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2568,"/dora",&local_2569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2590,"bora",(allocator *)&gpath.field_0xcf);
  tinyusdz::Path::Path((Path *)local_2548,&local_2568,&local_2590);
  std::__cxx11::string::~string((string *)&local_2590);
  std::allocator<char>::~allocator((allocator<char> *)&gpath.field_0xcf);
  std::__cxx11::string::~string((string *)&local_2568);
  std::allocator<char>::~allocator((allocator<char> *)&local_2569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2688,"/dora2",&local_2689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_26b0,"bora",&local_26b1);
  tinyusdz::Path::Path((Path *)local_2668,&local_2688,&local_26b0);
  std::__cxx11::string::~string((string *)&local_26b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_26b1);
  std::__cxx11::string::~string((string *)&local_2688);
  std::allocator<char>::~allocator((allocator<char> *)&local_2689);
  bVar1 = tinyusdz::Path::has_prefix((Path *)local_1fa8,(Path *)local_2308);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x6c,"%s","apath.has_prefix(dpath) == true");
  bVar1 = tinyusdz::Path::has_prefix((Path *)local_1fa8,(Path *)local_2428);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x6d,"%s","apath.has_prefix(epath) == true");
  bVar1 = tinyusdz::Path::has_prefix((Path *)local_20c8,(Path *)local_1fa8);
  acutest_check_((byte)~bVar1 & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x6e,"%s","bpath.has_prefix(apath) == false");
  bVar1 = tinyusdz::Path::has_prefix((Path *)local_1fa8,(Path *)local_21e8);
  acutest_check_((byte)~bVar1 & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x6f,"%s","apath.has_prefix(cpath) == false");
  bVar1 = tinyusdz::Path::has_prefix((Path *)local_2548,(Path *)local_2308);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x70,"%s","fpath.has_prefix(dpath) == true");
  bVar1 = tinyusdz::Path::has_prefix((Path *)local_2548,(Path *)local_2548);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x71,"%s","fpath.has_prefix(fpath) == true");
  bVar1 = tinyusdz::Path::has_prefix((Path *)local_2668,(Path *)local_2548);
  acutest_check_((byte)~bVar1 & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x72,"%s","gpath.has_prefix(fpath) == false");
  tinyusdz::Path::~Path((Path *)local_2668);
  tinyusdz::Path::~Path((Path *)local_2548);
  tinyusdz::Path::~Path((Path *)local_2428);
  tinyusdz::Path::~Path((Path *)local_2308);
  tinyusdz::Path::~Path((Path *)local_21e8);
  tinyusdz::Path::~Path((Path *)local_20c8);
  tinyusdz::Path::~Path((Path *)local_1fa8);
  return;
}

Assistant:

void prim_type_test(void) {
  // Path
  {
    Path path("/", "");
    TEST_CHECK(path.is_root_path() == true);
    TEST_CHECK(path.is_root_prim() == false);
    // invalid 
    TEST_CHECK(path.get_parent_path().is_valid() == false);
  }

  {
    Path path("/bora", "");
    auto ret = path.split_at_root();
    TEST_CHECK(std::get<0>(ret).full_path_name() == "/bora");
    TEST_CHECK(std::get<1>(ret).is_empty() == true);
    TEST_CHECK(path.get_parent_path().full_path_name() == "/");
    TEST_CHECK(path.get_parent_prim_path().full_path_name() == "/bora");
  }

  {
    Path path("/dora/bora", "");
    TEST_CHECK(path.element_name() == "bora"); // leaf name
    auto ret = path.split_at_root();
    TEST_CHECK(std::get<0>(ret).is_valid() == true);
    TEST_CHECK(std::get<0>(ret).full_path_name() == "/dora");
    TEST_CHECK(std::get<1>(ret).is_valid() == true);
    TEST_CHECK(std::get<1>(ret).full_path_name() == "/bora");
  }

  {
    Path path("dora", "");
    auto ret = path.split_at_root();
    TEST_CHECK(std::get<0>(ret).is_empty() == true);
    TEST_CHECK(std::get<1>(ret).is_valid() == true);
    TEST_CHECK(std::get<1>(ret).full_path_name() == "dora");
    TEST_CHECK(path.get_parent_path().is_valid() == false);
  }

  {
    Path rpath("dora", "");
    TEST_CHECK(rpath.make_relative().full_path_name() == "dora");

    Path apath("/dora", "");
    TEST_CHECK(apath.make_relative().full_path_name() == "dora");

    Path cpath("/dora", "");
    Path c;
    TEST_CHECK(c.make_relative(cpath).full_path_name() == "dora"); // std::move
  }

  {
    Path rpath("/dora", "bora");
    TEST_CHECK(rpath.full_path_name() == "/dora.bora");

    // Currently Allow prop path in prim
    // TODO: Disallow prop path in prim
    Path apath("/dora.bora", "");
    TEST_CHECK(apath.full_path_name() == "/dora.bora");
    TEST_CHECK(apath.element_name() == "bora");
  }

  {
    Path apath("/dora", "bora");
    TEST_CHECK(apath.full_path_name() == "/dora.bora");
    TEST_CHECK(apath.element_name() == "bora");
    std::cout << "parent_path = " << apath.get_parent_path().full_path_name() << "\n";
    std::cout << "parent_path = " << apath.get_parent_prim_path().full_path_name() << "\n";

    TEST_CHECK(apath.get_parent_path().full_path_name() == "/dora");
  }

  {
    Path apath("/dora/bora", "");
    Path bpath("/dora", "");
    Path cpath("/doraa", "");
    Path dpath = bpath.AppendProperty("hello");
    Path epath = bpath.AppendProperty("hell");

    std::cout << "epath = " << epath.full_path_name() << "\n";

    TEST_CHECK(bpath < apath);
    TEST_CHECK(bpath < cpath);
    TEST_CHECK(bpath < dpath);
    TEST_CHECK(epath < dpath);
  }

  {
    Path apath("/dora/bora", "");
    Path bpath("/dora/bora2", "");
    Path cpath("/doraa", "");
    Path dpath("/", "");
    Path epath("/dora", "");
    Path fpath("/dora", "bora");
    Path gpath("/dora2", "bora");

    TEST_CHECK(apath.has_prefix(dpath) == true);
    TEST_CHECK(apath.has_prefix(epath) == true);
    TEST_CHECK(bpath.has_prefix(apath) == false);
    TEST_CHECK(apath.has_prefix(cpath) == false);
    TEST_CHECK(fpath.has_prefix(dpath) == true);
    TEST_CHECK(fpath.has_prefix(fpath) == true);
    TEST_CHECK(gpath.has_prefix(fpath) == false);
  }

}